

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMXPathExpressionImpl.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::DOMXPathExpressionImpl::testNode
          (DOMXPathExpressionImpl *this,XPathMatcher *matcher,DOMXPathResultImpl *result,
          DOMElement *node)

{
  XMLStringPool *pXVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint uriId;
  uint uriId_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar5;
  XMLSize_t maxElems;
  long *plVar6;
  XMLAttr *this_00;
  undefined8 uVar7;
  XMLCh *rawName;
  XMLCh *attrValue;
  undefined4 extraout_var_02;
  DOMElement *node_00;
  undefined4 extraout_var_04;
  XMLSize_t XVar8;
  RefVectorOf<xercesc_4_0::XMLAttr> attrList;
  QName qName;
  SchemaElementDecl elemDecl;
  undefined4 extraout_var_01;
  undefined4 extraout_var_03;
  
  pXVar1 = this->fStringPool;
  iVar4 = (*(node->super_DOMNode)._vptr_DOMNode[0x16])(node);
  uriId = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])
                    (pXVar1,CONCAT44(extraout_var,iVar4));
  iVar4 = (*(node->super_DOMNode)._vptr_DOMNode[2])(node);
  QName::QName(&qName,(XMLCh *)CONCAT44(extraout_var_00,iVar4),uriId,this->fMemoryManager);
  SchemaElementDecl::SchemaElementDecl
            (&elemDecl,&qName,Any,0xfffffffe,XMLPlatformUtils::fgMemoryManager);
  iVar4 = (*(node->super_DOMNode)._vptr_DOMNode[0xb])(node);
  plVar5 = (long *)CONCAT44(extraout_var_01,iVar4);
  maxElems = (**(code **)(*plVar5 + 0x28))(plVar5);
  RefVectorOf<xercesc_4_0::XMLAttr>::RefVectorOf(&attrList,maxElems,true,this->fMemoryManager);
  for (XVar8 = 0; maxElems != XVar8; XVar8 = XVar8 + 1) {
    plVar6 = (long *)(**(code **)(*plVar5 + 0x18))(plVar5);
    this_00 = (XMLAttr *)XMemory::operator_new(0x28,this->fMemoryManager);
    pXVar1 = this->fStringPool;
    uVar7 = (**(code **)(*plVar6 + 0xb0))(plVar6);
    uriId_00 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,uVar7);
    rawName = (XMLCh *)(**(code **)(*plVar6 + 0x10))(plVar6);
    attrValue = (XMLCh *)(**(code **)(*plVar6 + 0x18))(plVar6);
    bVar2 = (bool)(**(code **)(*plVar6 + 0x148))(plVar6);
    XMLAttr::XMLAttr(this_00,uriId_00,rawName,attrValue,AttTypes_Min,bVar2,this->fMemoryManager,
                     (DatatypeValidator *)0x0,true);
    BaseRefVectorOf<xercesc_4_0::XMLAttr>::addElement
              (&attrList.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,this_00);
  }
  iVar4 = (*(node->super_DOMNode)._vptr_DOMNode[0x17])(node);
  (*matcher->_vptr_XPathMatcher[4])
            (matcher,&elemDecl,(ulong)uriId,CONCAT44(extraout_var_02,iVar4),&attrList,maxElems,0);
  bVar3 = XPathMatcher::isMatched(matcher);
  if ((bVar3 == 0) || (bVar3 == 0xd)) {
LAB_0028eee2:
    iVar4 = (*(node->super_DOMNode)._vptr_DOMNode[7])(node);
    node_00 = (DOMElement *)CONCAT44(extraout_var_03,iVar4);
    while (node_00 != (DOMElement *)0x0) {
      iVar4 = (*(node_00->super_DOMNode)._vptr_DOMNode[4])(node_00);
      if (iVar4 == 1) {
        bVar2 = testNode(this,matcher,result,node_00);
        if (bVar2) {
          bVar2 = true;
          goto LAB_0028ef82;
        }
      }
      iVar4 = (*(node_00->super_DOMNode)._vptr_DOMNode[10])(node_00);
      node_00 = (DOMElement *)CONCAT44(extraout_var_04,iVar4);
    }
  }
  else {
    DOMXPathResultImpl::addResult(result,&node->super_DOMNode);
    iVar4 = (*(result->super_DOMXPathResult)._vptr_DOMXPathResult[2])();
    bVar2 = true;
    if (iVar4 == 8) goto LAB_0028ef82;
    iVar4 = (*(result->super_DOMXPathResult)._vptr_DOMXPathResult[2])();
    if (iVar4 == 9) goto LAB_0028ef82;
    if ((bVar3 | 8) == 0xd) goto LAB_0028eee2;
  }
  bVar2 = false;
  (*matcher->_vptr_XPathMatcher[5])(matcher,&elemDecl,&XMLUni::fgZeroLenString,0,0);
LAB_0028ef82:
  RefVectorOf<xercesc_4_0::XMLAttr>::~RefVectorOf(&attrList);
  SchemaElementDecl::~SchemaElementDecl(&elemDecl);
  QName::~QName(&qName);
  return bVar2;
}

Assistant:

bool DOMXPathExpressionImpl::testNode(XPathMatcher* matcher, DOMXPathResultImpl* result, DOMElement *node) const
{
    int uriId=fStringPool->addOrFind(node->getNamespaceURI());
    QName qName(node->getNodeName(), uriId, fMemoryManager);
    SchemaElementDecl elemDecl(&qName);
    DOMNamedNodeMap* attrMap=node->getAttributes();
    XMLSize_t attrCount = attrMap->getLength();
    RefVectorOf<XMLAttr> attrList(attrCount, true, fMemoryManager);
    for(XMLSize_t i=0;i<attrCount;i++)
    {
        DOMAttr* attr=(DOMAttr*)attrMap->item(i);
        attrList.addElement(new (fMemoryManager) XMLAttr(fStringPool->addOrFind(attr->getNamespaceURI()),
                                                         attr->getNodeName(),
                                                         attr->getNodeValue(),
                                                         XMLAttDef::CData,
                                                         attr->getSpecified(),
                                                         fMemoryManager,
                                                         NULL,
                                                         true));
    }
    matcher->startElement(elemDecl, uriId, node->getPrefix(), attrList, attrCount);
    unsigned char nMatch=matcher->isMatched();
    if(nMatch!=0 && nMatch!=XPathMatcher::XP_MATCHED_DP)
    {
        result->addResult(node);
        if(result->getResultType()==DOMXPathResult::ANY_UNORDERED_NODE_TYPE || result->getResultType()==DOMXPathResult::FIRST_ORDERED_NODE_TYPE)
            return true;    // abort navigation, we found one result
    }

    if(nMatch==0 || nMatch==XPathMatcher::XP_MATCHED_D || nMatch==XPathMatcher::XP_MATCHED_DP)
    {
        DOMNode* child=node->getFirstChild();
        while(child)
        {
            if(child->getNodeType()==DOMNode::ELEMENT_NODE)
                if(testNode(matcher, result, (DOMElement*)child))
                    return true;
            child=child->getNextSibling();
        }
    }
    matcher->endElement(elemDecl, XMLUni::fgZeroLenString);
    return false;
}